

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::leaf_node<int,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<int,true>>::operator=
          (ref<immutable::rrb_details::leaf_node<int,true>> *this,
          ref<immutable::rrb_details::internal_node<int,_true>_> *r)

{
  ref<immutable::rrb_details::leaf_node<int,_true>_> local_20;
  ref<immutable::rrb_details::leaf_node<int,_true>_> temp;
  ref<immutable::rrb_details::internal_node<int,_true>_> *r_local;
  ref<immutable::rrb_details::leaf_node<int,_true>_> *this_local;
  
  temp.ptr = (leaf_node<int,_true> *)r;
  ref<immutable::rrb_details::internal_node<int,true>>
            ((ref<immutable::rrb_details::leaf_node<int,true>> *)&local_20,r);
  ref<immutable::rrb_details::leaf_node<int,_true>_>::swap
            ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)this,&local_20);
  ref<immutable::rrb_details::leaf_node<int,_true>_>::~ref(&local_20);
  return (ref<immutable::rrb_details::leaf_node<int,_true>_> *)this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }